

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O0

bool __thiscall
binlog::SessionWriter::addEvent<>(SessionWriter *this,uint64_t eventSourceId,uint64_t clock)

{
  bool bVar1;
  size_t in_RDI;
  size_t totalSize;
  size_t s;
  size_t *__end0;
  size_t *__begin0;
  size_t (*__range2) [2];
  size_t sizes [2];
  size_t size;
  QueueWriter *in_stack_ffffffffffffff68;
  unsigned_long *in_stack_ffffffffffffff70;
  unsigned_long *in;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 uVar3;
  undefined1 local_64 [12];
  long local_58;
  long *local_50;
  long *local_48;
  long *local_40;
  long local_38 [2];
  long local_28 [5];
  
  local_28[0] = 0;
  local_38[0] = 8;
  local_38[1] = 8;
  local_50 = local_28;
  local_40 = local_38;
  for (local_48 = local_40; local_48 != local_50; local_48 = local_48 + 1) {
    local_58 = *local_48;
    local_28[0] = local_58 + local_28[0];
  }
  local_64._4_8_ = local_28[0] + 4;
  bVar1 = detail::QueueWriter::beginWrite
                    ((QueueWriter *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_RDI);
  if (!bVar1) {
    replaceChannel((SessionWriter *)sizes[1],sizes[0]);
    bVar1 = detail::QueueWriter::beginWrite
                      ((QueueWriter *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_RDI);
    if (!bVar1) {
      return false;
    }
  }
  uVar2 = (undefined4)local_28[0];
  mserialize::serialize<unsigned_int,binlog::detail::QueueWriter>
            ((uint *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  uVar3 = 0;
  mserialize::serialize<unsigned_long,binlog::detail::QueueWriter>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  in = (unsigned_long *)local_64;
  mserialize::serialize<unsigned_long,binlog::detail::QueueWriter>(in,in_stack_ffffffffffffff68);
  *(undefined4 *)in = 0;
  detail::QueueWriter::endWrite((QueueWriter *)CONCAT44(uVar3,uVar2));
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}